

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O1

Matrix33d * gmath::inv(Matrix33d *__return_storage_ptr__,Matrix33d *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  long lVar12;
  Matrix33d *ret;
  undefined1 auVar13 [16];
  double dVar15;
  double dVar16;
  long lVar14;
  
  dVar1 = a->v[0][0];
  dVar2 = a->v[0][1];
  dVar3 = a->v[1][1];
  dVar6 = a->v[2][1];
  dVar7 = a->v[2][2];
  dVar8 = a->v[0][2];
  dVar9 = a->v[1][0];
  dVar10 = a->v[1][2];
  dVar11 = a->v[2][0];
  __return_storage_ptr__->v[2][0] = 0.0;
  __return_storage_ptr__->v[2][1] = 0.0;
  __return_storage_ptr__->v[1][1] = 0.0;
  __return_storage_ptr__->v[1][2] = 0.0;
  __return_storage_ptr__->v[0][2] = 0.0;
  __return_storage_ptr__->v[1][0] = 0.0;
  __return_storage_ptr__->v[0][0] = 0.0;
  __return_storage_ptr__->v[0][1] = 0.0;
  __return_storage_ptr__->v[2][2] = 0.0;
  auVar4 = _DAT_00163c20;
  lVar12 = 0;
  auVar13 = _DAT_00163c10;
  do {
    if (SUB164(auVar13 ^ auVar4,4) == -0x80000000 && SUB164(auVar13 ^ auVar4,0) < -0x7ffffffd) {
      *(undefined8 *)((long)__return_storage_ptr__->v[0] + lVar12) = 0x3ff0000000000000;
      *(undefined8 *)((long)__return_storage_ptr__->v[1] + lVar12 + 8) = 0x3ff0000000000000;
    }
    lVar14 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 2;
    auVar13._8_8_ = lVar14 + 2;
    lVar12 = lVar12 + 0x40;
  } while (lVar12 != 0x80);
  dVar15 = dVar3 * -dVar8;
  dVar16 = 1.0 / ((dVar6 * -dVar10 * dVar1 +
                  dVar11 * dVar15 +
                  dVar11 * dVar2 * dVar10 + dVar7 * dVar1 * dVar3 + dVar9 * dVar6 * dVar8) -
                 dVar9 * dVar2 * dVar7);
  __return_storage_ptr__->v[0][0] = (dVar3 * dVar7 + dVar6 * -dVar10) * dVar16;
  __return_storage_ptr__->v[0][1] = (dVar8 * dVar6 + dVar7 * -dVar2) * dVar16;
  dVar5 = (dVar10 * dVar11 + dVar7 * -dVar9) * dVar16;
  auVar4._8_4_ = SUB84(dVar5,0);
  auVar4._0_8_ = (dVar2 * dVar10 + dVar15) * dVar16;
  auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
  *(undefined1 (*) [16])(__return_storage_ptr__->v[0] + 2) = auVar4;
  __return_storage_ptr__->v[1][1] = (dVar7 * dVar1 + -dVar8 * dVar11) * dVar16;
  __return_storage_ptr__->v[1][2] = (dVar9 * dVar8 + -dVar1 * dVar10) * dVar16;
  __return_storage_ptr__->v[2][0] = (dVar6 * dVar9 - dVar11 * dVar3) * dVar16;
  __return_storage_ptr__->v[2][1] = (dVar11 * dVar2 - dVar6 * dVar1) * dVar16;
  __return_storage_ptr__->v[2][2] = (-dVar2 * dVar9 + dVar1 * dVar3) * dVar16;
  return __return_storage_ptr__;
}

Assistant:

Matrix33d inv(const Matrix33d &a)
{
  double d=det(a);

  assert(d != 0);

  d=1.0/d;

  Matrix33d ret;

  ret(0, 0)=d*(a(1, 1)*a(2, 2)-a(1, 2)*a(2, 1));
  ret(0, 1)=d*(a(0, 2)*a(2, 1)-a(0, 1)*a(2, 2));
  ret(0, 2)=d*(a(0, 1)*a(1, 2)-a(0, 2)*a(1, 1));

  ret(1, 0)=d*(a(1, 2)*a(2, 0)-a(1, 0)*a(2, 2));
  ret(1, 1)=d*(a(0, 0)*a(2, 2)-a(0, 2)*a(2, 0));
  ret(1, 2)=d*(a(0, 2)*a(1, 0)-a(0, 0)*a(1, 2));

  ret(2, 0)=d*(a(1, 0)*a(2, 1)-a(1, 1)*a(2, 0));
  ret(2, 1)=d*(a(0, 1)*a(2, 0)-a(0, 0)*a(2, 1));
  ret(2, 2)=d*(a(0, 0)*a(1, 1)-a(0, 1)*a(1, 0));

  return ret;
}